

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record.cpp
# Opt level: O2

string * __thiscall Record::toString_abi_cxx11_(string *__return_storage_ptr__,Record *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  string local_38;
  
  std::operator+(&local_78,&this->tconst,",");
  std::__cxx11::to_string(&local_58,this->averageRating);
  std::operator+(&local_98,&local_78,&local_58);
  std::operator+(&local_b8,&local_98,",");
  std::__cxx11::to_string(&local_38,this->numVotes);
  std::operator+(&local_d8,&local_b8,&local_38);
  std::operator+(__return_storage_ptr__,&local_d8,"\n");
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string Record::toString() {
    return tconst + "," + std::to_string(averageRating) + "," + std::to_string(numVotes) + "\n";
}